

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall
Inline::BuildIRForInlinee
          (Inline *this,Func *inlinee,JITTimeFunctionBody *funcBody,Instr *callInstr,
          bool isApplyTarget,uint recursiveInlineDepth)

{
  uint uVar1;
  Func *this_00;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  SymTable *this_01;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  ArgSlot AVar7;
  uint uVar8;
  uint uVar9;
  RegSlot IDIncrease;
  StackSym *pSVar10;
  undefined4 *puVar11;
  JITTimeFunctionBody *pJVar12;
  intptr_t iVar13;
  intptr_t iVar14;
  uint uVar15;
  Instr *pIVar16;
  ushort callerArgOutCount;
  Instr *pIVar17;
  undefined1 local_278 [8];
  Inline recursiveInliner;
  Instr *apIStack_f0 [2];
  Instr *argOuts [15];
  undefined1 local_60 [8];
  AutoCodeGenPhase __autoCodeGen;
  
  this_00 = this->topFunc;
  uVar1 = this->currentForInDepth;
  __autoCodeGen._8_8_ = funcBody;
  uVar8 = JITTimeFunctionBody::GetForInLoopDepth(funcBody);
  Func::UpdateForInLoopMaxDepth(this_00,uVar1 + uVar8);
  inlinee->m_forInLoopBaseDepth = this->currentForInDepth;
  argOuts[0xd] = (Instr *)0xfefefefefefefefe;
  argOuts[0xb] = (Instr *)0xfefefefefefefefe;
  argOuts[0xc] = (Instr *)0xfefefefefefefefe;
  argOuts[9] = (Instr *)0xfefefefefefefefe;
  argOuts[10] = (Instr *)0xfefefefefefefefe;
  argOuts[7] = (Instr *)0xfefefefefefefefe;
  argOuts[8] = (Instr *)0xfefefefefefefefe;
  argOuts[5] = (Instr *)0xfefefefefefefefe;
  argOuts[6] = (Instr *)0xfefefefefefefefe;
  argOuts[3] = (Instr *)0xfefefefefefefefe;
  argOuts[4] = (Instr *)0xfefefefefefefefe;
  argOuts[1] = (Instr *)0xfefefefefefefefe;
  argOuts[2] = (Instr *)0xfefefefefefefefe;
  apIStack_f0[1] = (Instr *)0xfefefefefefefefe;
  argOuts[0] = (Instr *)0xfefefefefefefefe;
  pSVar10 = IR::Opnd::GetStackSym(callInstr->m_src2);
  pIVar16 = (pSVar10->field_5).m_instrDef;
  if ((pIVar16 != (Instr *)0x0 & pSVar10->field_0x18) == 1) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar6) {
LAB_0054bca4:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
    pIVar16 = (pSVar10->field_5).m_instrDef;
  }
  callerArgOutCount = 0;
  do {
    if (pIVar16->m_src2 == (Opnd *)0x0) {
LAB_0054b9d4:
      pIVar17 = (Instr *)0x0;
    }
    else {
      OVar5 = IR::Opnd::GetKind(pIVar16->m_src2);
      if (OVar5 != OpndKindSym) goto LAB_0054b9d4;
      pOVar2 = pIVar16->m_src2;
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) goto LAB_0054bca4;
        *puVar11 = 0;
      }
      pp_Var3 = pOVar2[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar6) goto LAB_0054bca4;
        *puVar11 = 0;
      }
      uVar9 = *(uint *)(pp_Var3 + 3);
      uVar15 = uVar9 & 0x100000;
      if ((uVar15 != 0) && (*(short *)((long)pp_Var3 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar6) goto LAB_0054bca4;
        *puVar11 = 0;
        uVar9 = *(uint *)(pp_Var3 + 3);
        uVar15 = uVar9 & 0x100000;
      }
      if (uVar15 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar6) goto LAB_0054bca4;
        *puVar11 = 0;
        uVar9 = *(uint *)(pp_Var3 + 3);
      }
      if (((uVar9 & 1) == 0) || (pp_Var3[5] == (_func_int *)0x0)) {
        bVar6 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase);
        if (!bVar6) {
          bVar6 = Func::IsInPhase(callInstr->m_func,FGBuildPhase);
          if (!bVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar6) goto LAB_0054bca4;
            *puVar11 = 0;
          }
        }
      }
      if (((ulong)pp_Var3[3] & 1) == 0) goto LAB_0054b9d4;
      pIVar17 = (Instr *)pp_Var3[5];
    }
    if (pIVar16->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar16->m_opcode == StartCall) {
        if (pIVar17 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar6) goto LAB_0054bca4;
          *puVar11 = 0;
        }
        break;
      }
      pOVar2 = pIVar16->m_dst;
      OVar5 = IR::Opnd::GetKind(pOVar2);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) goto LAB_0054bca4;
        *puVar11 = 0;
      }
      pSVar10 = (StackSym *)pOVar2[1]._vptr_Opnd;
      if ((pSVar10->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar6) goto LAB_0054bca4;
        *puVar11 = 0;
      }
      AVar7 = StackSym::GetArgSlotNum(pSVar10);
      apIStack_f0[AVar7] = pIVar16;
      callerArgOutCount = callerArgOutCount + 1;
    }
    pIVar16 = pIVar17;
  } while (pIVar17 != (Instr *)0x0);
  inlinee->actualCount = callerArgOutCount;
  this_01 = this->topFunc->m_symTable;
  inlinee->m_symTable = this_01;
  this_01->m_IDAdjustment = this_01->m_currentID;
  IDIncrease = JITTimeFunctionBody::GetLocalsCount((JITTimeFunctionBody *)__autoCodeGen._8_8_);
  SymTable::IncreaseStartingID(this_01,IDIncrease);
  local_60 = (undefined1  [8])this->topFunc;
  __autoCodeGen.func._0_4_ = 0x35;
  Func::BeginPhase((Func *)local_60,IRBuilderPhase);
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
  bVar6 = JITTimeFunctionBody::IsAsmJsMode(pJVar12);
  if (bVar6) {
    IRBuilderAsmJs::IRBuilderAsmJs((IRBuilderAsmJs *)local_278,inlinee);
    IRBuilderAsmJs::Build((IRBuilderAsmJs *)local_278);
  }
  else {
    IRBuilder::IRBuilder((IRBuilder *)local_278,inlinee);
    IRBuilder::Build((IRBuilder *)local_278);
    IRBuilder::~IRBuilder((IRBuilder *)local_278);
  }
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_60,this->topFunc,IRBuilderPhase,false,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_60);
  inlinee->m_symTable->m_IDAdjustment = 0;
  local_278 = (undefined1  [8])this->topFunc;
  recursiveInliner._24_8_ = this->inliningHeuristics;
  recursiveInliner.currentInlineeFrameSlot = this->isInLoop;
  recursiveInliner.topFunc._4_4_ = this->currentInlineeFrameSlot + (uint)callerArgOutCount + 3;
  recursiveInliner.topFunc._0_4_ = 0;
  recursiveInliner.currentForInDepth._1_1_ = 0;
  recursiveInliner.currentForInDepth._0_1_ = isApplyTarget;
  recursiveInliner.lastStatementBoundary = (PragmaInstr *)this;
  recursiveInliner.prevFrame = (Inline *)callInstr;
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(inlinee->m_workItem);
  iVar13 = JITTimeFunctionBody::GetAddr(pJVar12);
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(callInstr->m_func->m_workItem);
  iVar14 = JITTimeFunctionBody::GetAddr(pJVar12);
  uVar1 = recursiveInlineDepth + 1;
  if (iVar13 != iVar14) {
    uVar1 = 0;
  }
  Optimize((Inline *)local_278,inlinee,apIStack_f0 + 1,callerArgOutCount,uVar1);
  AVar7 = JITTimeFunctionBody::GetInParamsCount((JITTimeFunctionBody *)__autoCodeGen._8_8_);
  if (AVar7 < 0x10) {
    return;
  }
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void
Inline::BuildIRForInlinee(Func *inlinee, JITTimeFunctionBody *funcBody, IR::Instr *callInstr, bool isApplyTarget, uint recursiveInlineDepth)
{
    // Update for..in max depth for the whole function
    this->topFunc->UpdateForInLoopMaxDepth(this->currentForInDepth + funcBody->GetForInLoopDepth());

    // Set for..in base depth of inlinee
    inlinee->m_forInLoopBaseDepth = this->currentForInDepth;

    Js::ArgSlot actualsCount = 0;
    IR::Instr *argOuts[Js::InlineeCallInfo::MaxInlineeArgoutCount];
#if DBG
    memset(argOuts, 0xFE, sizeof(argOuts));
#endif

    callInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        StackSym *argSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        argOuts[argSym->GetArgSlotNum() - 1] = argInstr;
        actualsCount++;
        return false;
    });

    inlinee->actualCount = actualsCount;

    inlinee->m_symTable = this->topFunc->m_symTable;

    inlinee->m_symTable->SetIDAdjustment();
    inlinee->m_symTable->IncreaseStartingID(funcBody->GetLocalsCount());

    BEGIN_CODEGEN_PHASE(this->topFunc, Js::IRBuilderPhase);

#ifdef ASMJS_PLAT
    if (this->topFunc->GetJITFunctionBody()->IsAsmJsMode())
    {
        IRBuilderAsmJs irBuilder(inlinee);
        irBuilder.Build();
    }
    else
#endif
    {
        IRBuilder irBuilder(inlinee);
        irBuilder.Build();
    }

    END_CODEGEN_PHASE_NO_DUMP(this->topFunc, Js::IRBuilderPhase);

    inlinee->m_symTable->ClearIDAdjustment();

    Inline recursiveInliner(this->topFunc, this->inliningHeuristics, this->isInLoop, currentInlineeFrameSlot + Js::Constants::InlineeMetaArgCount + actualsCount, isApplyTarget, this, callInstr);
    recursiveInliner.Optimize(inlinee, argOuts, actualsCount, inlinee->GetJITFunctionBody()->GetAddr() == callInstr->m_func->GetJITFunctionBody()->GetAddr() ? recursiveInlineDepth + 1 : 0);

#ifdef DBG
    Js::ArgSlot formalCount = funcBody->GetInParamsCount();

    if (formalCount > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        Fatal();
    }
#endif
}